

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse41_128_16.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_table_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  undefined2 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  int *piVar14;
  int *piVar15;
  int *piVar16;
  int *piVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  short sVar48;
  short sVar49;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *piVar50;
  int j_00;
  ushort uVar51;
  ushort uVar52;
  short sVar53;
  ushort uVar60;
  short sVar61;
  ushort uVar63;
  short sVar64;
  ushort uVar65;
  ushort uVar66;
  short sVar67;
  ulong uVar54;
  ulong uVar55;
  ushort uVar59;
  ushort uVar62;
  ushort uVar68;
  ushort uVar69;
  short sVar70;
  ushort uVar74;
  ushort uVar77;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  ushort uVar75;
  short sVar76;
  ushort uVar78;
  short sVar79;
  ushort uVar80;
  ushort uVar81;
  short sVar82;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  undefined1 auVar83 [16];
  __m128i vWH_00;
  ushort local_d5c;
  int local_d40;
  int local_d3c;
  int local_d28;
  int local_d24;
  int local_d10;
  int local_d0c;
  int local_cf8;
  int local_cf4;
  int local_ce0;
  int local_cdc;
  int local_cc8;
  int local_cc4;
  int local_cb0;
  int local_cac;
  int local_c98;
  int local_c94;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c58;
  undefined8 uStack_c50;
  int local_c30;
  int local_c2c;
  longlong *plStack_c28;
  int32_t k;
  int16_t *j_1;
  int16_t *i_1;
  int16_t *u;
  int16_t *t;
  int16_t *s;
  int16_t last_val;
  int16_t max_col;
  int16_t max_row;
  __m128i cond_all_col;
  __m128i cond_all_row;
  __m128i cond_last_val;
  __m128i cond_max_col;
  __m128i cond_max_row;
  __m128i cond_i;
  __m128i cond_j;
  __m128i vJltLimit;
  __m128i vJgtNegOne;
  __m128i vJeqLimit1;
  __m128i cond;
  __m128i vNWH;
  __m128i vMat;
  __m128i vIeqLimit1;
  __m128i vIltLimit;
  int *matrow7;
  int *matrow6;
  int *matrow5;
  int *matrow4;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m128i vJ;
  __m128i vF;
  __m128i vE;
  __m128i vWH;
  __m128i vNH;
  __m128i vIBoundary;
  __m128i vJLimit1;
  __m128i vJLimit;
  __m128i vILimit1;
  __m128i vILimit;
  __m128i vEndJ;
  __m128i vEndI;
  __m128i vLastVal;
  __m128i vMaxHCol;
  __m128i vMaxHRow;
  __m128i vJreset;
  __m128i vI;
  __m128i vNegOne;
  __m128i vGapN;
  __m128i vN;
  __m128i vOne;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int iStack_900;
  int16_t score;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int16_t *F_pr;
  int16_t *H_pr;
  int16_t *s2;
  int16_t *_F_pr;
  int16_t *_H_pr;
  int16_t *s2B;
  int16_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  short local_4e8;
  short sStack_4e6;
  short sStack_4e4;
  short sStack_4e2;
  short sStack_4e0;
  short sStack_4de;
  short sStack_4dc;
  short sStack_4da;
  short local_4b8;
  short sStack_4b6;
  short sStack_4b4;
  short sStack_4b2;
  short sStack_4b0;
  short sStack_4ae;
  short sStack_4ac;
  short sStack_4aa;
  short local_4a8;
  short sStack_4a6;
  short sStack_4a4;
  short sStack_4a2;
  short sStack_4a0;
  short sStack_49e;
  short sStack_49c;
  short sStack_49a;
  short local_478;
  short sStack_476;
  short sStack_474;
  short sStack_472;
  short sStack_470;
  short sStack_46e;
  short sStack_46c;
  short sStack_46a;
  short local_438;
  short sStack_436;
  short sStack_434;
  short sStack_432;
  short sStack_430;
  short sStack_42e;
  short sStack_42c;
  short sStack_42a;
  short local_428;
  short sStack_426;
  short sStack_424;
  short sStack_422;
  short sStack_420;
  short sStack_41e;
  short sStack_41c;
  short sStack_41a;
  short local_418;
  short sStack_416;
  short sStack_414;
  short sStack_412;
  short sStack_410;
  short sStack_40e;
  short sStack_40c;
  short sStack_40a;
  short local_408;
  short sStack_406;
  short sStack_404;
  short sStack_402;
  short sStack_400;
  short sStack_3fe;
  short sStack_3fc;
  short sStack_3fa;
  short local_3f8;
  short sStack_3f6;
  short sStack_3f4;
  short sStack_3f2;
  short sStack_3f0;
  short sStack_3ee;
  short sStack_3ec;
  short sStack_3ea;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short sStack_200;
  short sStack_1fe;
  short sStack_1fc;
  short sStack_1fa;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  short sStack_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short local_178;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short sStack_170;
  short sStack_16e;
  short sStack_16c;
  short sStack_16a;
  short local_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  short sStack_160;
  short sStack_15e;
  short sStack_15c;
  short sStack_15a;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  
  s2B = (int16_t *)0x0;
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_diag_sse41_128_16","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_diag_sse41_128_16","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_diag_sse41_128_16","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_diag_sse41_128_16","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_diag_sse41_128_16","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_diag_sse41_128_16","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_diag_sse41_128_16","_s1Len")
        ;
        return (parasail_result_t *)0x0;
      }
    }
    local_c30 = _s1Len;
    if (matrix->type != 0) {
      local_c30 = matrix->length;
    }
    _POS_LIMIT = 0;
    iStack_900 = 0;
    N._0_2_ = (short)open;
    sVar48 = (short)N;
    if (matrix->min <= -open) {
      sVar48 = -(short)matrix->min;
    }
    sVar48 = sVar48 + -0x7fff;
    sVar49 = ((ushort)matrix->max ^ 0x7fff) - 1;
    vNegInf[1] = CONCAT26(sVar48,CONCAT24(sVar48,CONCAT22(sVar48,sVar48)));
    vSaturationCheckMax[0] = CONCAT26(sVar48,CONCAT24(sVar48,CONCAT22(sVar48,sVar48)));
    vSaturationCheckMax[1] = CONCAT26(sVar49,CONCAT24(sVar49,CONCAT22(sVar49,sVar49)));
    vSaturationCheckMin[0] = CONCAT26(sVar49,CONCAT24(sVar49,CONCAT22(sVar49,sVar49)));
    uVar18 = CONCAT26(sVar48,CONCAT24(sVar48,CONCAT22(sVar48,sVar48)));
    uVar73 = CONCAT26(sVar48,CONCAT24(sVar48,CONCAT22(sVar48,sVar48)));
    uVar19 = CONCAT26((short)N,CONCAT24((short)N,CONCAT22((short)N,(short)N)));
    uVar21 = CONCAT26((short)N,CONCAT24((short)N,CONCAT22((short)N,(short)N)));
    PAD._0_2_ = (short)gap;
    uVar20 = CONCAT26((short)PAD,CONCAT24((short)PAD,CONCAT22((short)PAD,(short)PAD)));
    uVar22 = CONCAT26((short)PAD,CONCAT24((short)PAD,CONCAT22((short)PAD,(short)PAD)));
    if (s1_beg == 0) {
      sVar53 = (short)PAD * 8;
      local_c58 = CONCAT26(sVar53,CONCAT24(sVar53,CONCAT22(sVar53,sVar53)));
      uStack_c50 = CONCAT26(sVar53,CONCAT24(sVar53,CONCAT22(sVar53,sVar53)));
    }
    else {
      local_c58 = 0;
      uStack_c50 = 0;
    }
    vI[0]._0_6_ = 0x100020003;
    vJreset[1] = 0x4000500060007;
    vI[0]._6_2_ = 0;
    vMaxHRow[0] = uVar73;
    vMaxHCol[1] = uVar18;
    vMaxHCol[0] = uVar73;
    vLastVal[1] = uVar18;
    vLastVal[0] = uVar73;
    vEndI[1] = uVar18;
    vEndI[0] = uVar73;
    vEndJ[1] = uVar18;
    vEndJ[0] = uVar73;
    vILimit[1] = uVar18;
    s2Len_PAD._0_2_ = (short)local_c30;
    auVar30._2_2_ = (short)s2Len_PAD;
    auVar30._0_2_ = (short)s2Len_PAD;
    auVar30._4_2_ = (short)s2Len_PAD;
    auVar30._6_2_ = (short)s2Len_PAD;
    vILimit[0] = CONCAT26((short)s2Len_PAD,
                          CONCAT24((short)s2Len_PAD,CONCAT22((short)s2Len_PAD,(short)s2Len_PAD)));
    auVar30._8_8_ = vILimit[0];
    auVar56._8_8_ = 0x1000100010001;
    auVar56._0_8_ = 0x1000100010001;
    auVar56 = psubsw(auVar30,auVar56);
    gap_local._0_2_ = (short)s2Len;
    auVar58._2_2_ = (short)gap_local;
    auVar58._0_2_ = (short)gap_local;
    auVar58._4_2_ = (short)gap_local;
    auVar58._6_2_ = (short)gap_local;
    auVar58._10_2_ = (short)gap_local;
    auVar58._8_2_ = (short)gap_local;
    auVar58._12_2_ = (short)gap_local;
    auVar58._14_2_ = (short)gap_local;
    auVar57._8_8_ = 0x1000100010001;
    auVar57._0_8_ = 0x1000100010001;
    auVar57 = psubsw(auVar58,auVar57);
    if (s1_beg == 0) {
      sVar53 = -(short)N;
      j_00 = CONCAT22((short)((uint)gap >> 0x10),sVar53 - (short)PAD);
      local_c78 = CONCAT26(sVar53 - (short)(gap << 2),
                           CONCAT24(sVar53 + (short)PAD * -5,
                                    CONCAT22(sVar53 + (short)PAD * -6,
                                             ((short)PAD - (short)(gap << 3)) - (short)N)));
      uStack_c70 = CONCAT26(sVar53,CONCAT24(sVar53 - (short)PAD,
                                            CONCAT22(sVar53 + (short)PAD * -2,
                                                     sVar53 + (short)PAD * -3)));
    }
    else {
      local_c78 = 0;
      uStack_c70 = 0;
      j_00 = gap;
    }
    vIBoundary[0] = uStack_c70;
    vNH[1] = local_c78;
    _s1_local = (char *)parasail_result_new_table1(local_c30,s2Len);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x8201002;
      uVar23 = 0;
      if (s1_beg != 0) {
        uVar23 = 8;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar23 | ((parasail_result_t *)_s1_local)->flag;
      uVar23 = 0;
      if (s1_end != 0) {
        uVar23 = 0x10;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar23 | ((parasail_result_t *)_s1_local)->flag;
      uVar23 = 0;
      if (s2_beg != 0) {
        uVar23 = 0x4000;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar23 | ((parasail_result_t *)_s1_local)->flag;
      uVar23 = 0;
      if (s2_end != 0) {
        uVar23 = 0x8000;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar23 | ((parasail_result_t *)_s1_local)->flag;
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x20000;
      ptr = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_00 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_01 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      piVar50 = ptr + 7;
      if (ptr == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        if (matrix->type == 0) {
          s2B = parasail_memalign_int16_t(0x10,(long)(local_c30 + 7));
          if (s2B == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (end_query = 0; end_query < local_c30; end_query = end_query + 1) {
            s2B[end_query] = (int16_t)matrix->mapper[(byte)_s1[end_query]];
          }
          for (end_query = local_c30; end_query < local_c30 + 7; end_query = end_query + 1) {
            s2B[end_query] = 0;
          }
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          piVar50[end_ref] = (int16_t)matrix->mapper[(byte)_s2[end_ref]];
        }
        for (end_ref = -7; iVar2 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          piVar50[end_ref] = 0;
        }
        while (end_ref = iVar2, end_ref < s2Len + 7) {
          piVar50[end_ref] = 0;
          iVar2 = end_ref + 1;
        }
        if (s2_beg == 0) {
          for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
            ptr_00[(long)end_ref + 7] = -((short)end_ref * (short)PAD) - (short)N;
            ptr_01[(long)end_ref + 7] = sVar48;
          }
        }
        else {
          for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
            ptr_00[(long)end_ref + 7] = 0;
            ptr_01[(long)end_ref + 7] = sVar48;
          }
        }
        for (end_ref = -7; iVar2 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 7] = sVar48;
          ptr_01[(long)end_ref + 7] = sVar48;
        }
        while (end_ref = iVar2, end_ref < s2Len + 7) {
          ptr_00[(long)end_ref + 7] = sVar48;
          ptr_01[(long)end_ref + 7] = sVar48;
          iVar2 = end_ref + 1;
        }
        ptr_00[6] = 0;
        for (end_query = 0; end_query < local_c30; end_query = end_query + 8) {
          vNH[0] = uVar73;
          vWH[1] = uVar18;
          vWH[0] = uVar73;
          vE[1] = uVar18;
          vE[0] = uVar73;
          vF[1] = uVar18;
          vF[0] = uVar73;
          vJ[1] = uVar18;
          vJ[0]._0_6_ = 0xfffffffefffd;
          matrow0 = (int *)0xfffcfffbfffafff9;
          vJ[0]._6_2_ = 0;
          piVar10 = matrix->matrix;
          iVar2 = matrix->size;
          if (matrix->type == 0) {
            local_c94 = (int)s2B[end_query];
          }
          else {
            if (end_query < local_c30) {
              local_c98 = end_query;
            }
            else {
              local_c98 = local_c30 + -1;
            }
            local_c94 = local_c98;
          }
          piVar11 = matrix->matrix;
          iVar3 = matrix->size;
          if (matrix->type == 0) {
            local_cac = (int)s2B[end_query + 1];
          }
          else {
            if (end_query + 1 < local_c30) {
              local_cb0 = end_query + 1;
            }
            else {
              local_cb0 = local_c30 + -1;
            }
            local_cac = local_cb0;
          }
          piVar12 = matrix->matrix;
          iVar4 = matrix->size;
          if (matrix->type == 0) {
            local_cc4 = (int)s2B[end_query + 2];
          }
          else {
            if (end_query + 2 < local_c30) {
              local_cc8 = end_query + 2;
            }
            else {
              local_cc8 = local_c30 + -1;
            }
            local_cc4 = local_cc8;
          }
          piVar13 = matrix->matrix;
          iVar5 = matrix->size;
          if (matrix->type == 0) {
            local_cdc = (int)s2B[end_query + 3];
          }
          else {
            if (end_query + 3 < local_c30) {
              local_ce0 = end_query + 3;
            }
            else {
              local_ce0 = local_c30 + -1;
            }
            local_cdc = local_ce0;
          }
          piVar14 = matrix->matrix;
          iVar6 = matrix->size;
          if (matrix->type == 0) {
            local_cf4 = (int)s2B[end_query + 4];
          }
          else {
            if (end_query + 4 < local_c30) {
              local_cf8 = end_query + 4;
            }
            else {
              local_cf8 = local_c30 + -1;
            }
            local_cf4 = local_cf8;
          }
          piVar15 = matrix->matrix;
          iVar7 = matrix->size;
          if (matrix->type == 0) {
            local_d0c = (int)s2B[end_query + 5];
          }
          else {
            if (end_query + 5 < local_c30) {
              local_d10 = end_query + 5;
            }
            else {
              local_d10 = local_c30 + -1;
            }
            local_d0c = local_d10;
          }
          piVar16 = matrix->matrix;
          iVar8 = matrix->size;
          if (matrix->type == 0) {
            local_d24 = (int)s2B[end_query + 6];
          }
          else {
            if (end_query + 6 < local_c30) {
              local_d28 = end_query + 6;
            }
            else {
              local_d28 = local_c30 + -1;
            }
            local_d24 = local_d28;
          }
          piVar17 = matrix->matrix;
          iVar9 = matrix->size;
          if (matrix->type == 0) {
            local_d3c = (int)s2B[end_query + 7];
          }
          else {
            if (end_query + 7 < local_c30) {
              local_d40 = end_query + 7;
            }
            else {
              local_d40 = local_c30 + -1;
            }
            local_d3c = local_d40;
          }
          sStack_1d0 = (short)vILimit[0];
          sStack_1ce = (short)((ulong)vILimit[0] >> 0x10);
          sStack_1cc = (short)((ulong)vILimit[0] >> 0x20);
          sStack_1ca = (short)((ulong)vILimit[0] >> 0x30);
          local_1e8 = (short)vJreset[1];
          sStack_1e6 = vJreset[1]._2_2_;
          sStack_1e4 = vJreset[1]._4_2_;
          sStack_1e2 = vJreset[1]._6_2_;
          sStack_1e0 = (short)vJreset[2];
          sStack_1de = vJreset[2]._2_2_;
          sStack_1dc = vJreset[2]._4_2_;
          sStack_1da = vJreset[2]._6_2_;
          local_4a8 = auVar56._0_2_;
          sStack_4a6 = auVar56._2_2_;
          sStack_4a4 = auVar56._4_2_;
          sStack_4a2 = auVar56._6_2_;
          sStack_4a0 = auVar56._8_2_;
          sStack_49e = auVar56._10_2_;
          sStack_49c = auVar56._12_2_;
          sStack_49a = auVar56._14_2_;
          stack0xfffffffffffff578 = vWH._10_14_;
          vNH[0]._6_2_ = ptr_00[6];
          vE[1] = vE._10_8_;
          vWH[0] = uVar73 >> 0x10;
          if (s1_beg == 0) {
            local_d5c = -((short)end_query * (short)PAD) - (short)N;
          }
          else {
            local_d5c = 0;
          }
          vWH[0] = vWH[0] | (ulong)local_d5c << 0x30;
          ptr_00[6] = -(((short)end_query + 8) * (short)PAD) - (short)N;
          for (end_ref = 0; auVar30 = stack0xfffffffffffff578, auVar58 = stack0xfffffffffffff548,
              end_ref < s2Len + 7; end_ref = end_ref + 1) {
            stack0xfffffffffffff578 = vE._10_14_;
            vNH[0]._6_2_ = ptr_00[(long)end_ref + 7];
            auVar24 = stack0xfffffffffffff578;
            stack0xfffffffffffff548 = vJ._10_14_;
            vF[0]._6_2_ = ptr_01[(long)end_ref + 7];
            auVar25 = stack0xfffffffffffff548;
            vWH[1] = vE._10_8_;
            vNH[0] = auVar24._8_8_;
            auVar29._8_8_ = vNH[0];
            auVar29._0_8_ = vWH[1];
            auVar28._8_8_ = uVar21;
            auVar28._0_8_ = uVar19;
            auVar83 = psubsw(auVar29,auVar28);
            vJ[1] = auVar58._2_8_;
            vF[0] = auVar25._8_8_;
            auVar27._8_8_ = vF[0];
            auVar27._0_8_ = vJ[1];
            auVar26._8_8_ = uVar22;
            auVar26._0_8_ = uVar20;
            auVar58 = psubsw(auVar27,auVar26);
            local_3f8 = auVar83._0_2_;
            sStack_3f6 = auVar83._2_2_;
            sStack_3f4 = auVar83._4_2_;
            sStack_3f2 = auVar83._6_2_;
            sStack_3f0 = auVar83._8_2_;
            sStack_3ee = auVar83._10_2_;
            sStack_3ec = auVar83._12_2_;
            sStack_3ea = auVar83._14_2_;
            local_408 = auVar58._0_2_;
            sStack_406 = auVar58._2_2_;
            sStack_404 = auVar58._4_2_;
            sStack_402 = auVar58._6_2_;
            sStack_400 = auVar58._8_2_;
            sStack_3fe = auVar58._10_2_;
            sStack_3fc = auVar58._12_2_;
            sStack_3fa = auVar58._14_2_;
            uVar51 = (ushort)(local_3f8 < local_408) * local_408 |
                     (ushort)(local_3f8 >= local_408) * local_3f8;
            uVar59 = (ushort)(sStack_3f6 < sStack_406) * sStack_406 |
                     (ushort)(sStack_3f6 >= sStack_406) * sStack_3f6;
            uVar62 = (ushort)(sStack_3f4 < sStack_404) * sStack_404 |
                     (ushort)(sStack_3f4 >= sStack_404) * sStack_3f4;
            uVar65 = (ushort)(sStack_3f2 < sStack_402) * sStack_402 |
                     (ushort)(sStack_3f2 >= sStack_402) * sStack_3f2;
            uVar68 = (ushort)(sStack_3f0 < sStack_400) * sStack_400 |
                     (ushort)(sStack_3f0 >= sStack_400) * sStack_3f0;
            uVar74 = (ushort)(sStack_3ee < sStack_3fe) * sStack_3fe |
                     (ushort)(sStack_3ee >= sStack_3fe) * sStack_3ee;
            uVar77 = (ushort)(sStack_3ec < sStack_3fc) * sStack_3fc |
                     (ushort)(sStack_3ec >= sStack_3fc) * sStack_3ec;
            uVar80 = (ushort)(sStack_3ea < sStack_3fa) * sStack_3fa |
                     (ushort)(sStack_3ea >= sStack_3fa) * sStack_3ea;
            vJ[1] = CONCAT26(uVar65,CONCAT24(uVar62,CONCAT22(uVar59,uVar51)));
            vF[0]._0_2_ = uVar68;
            vF[0]._2_2_ = uVar74;
            vF[0]._4_2_ = uVar77;
            vF[0]._6_2_ = uVar80;
            auVar83._8_8_ = uVar21;
            auVar83._0_8_ = uVar19;
            auVar83 = psubsw(stack0xfffffffffffff568,auVar83);
            auVar25._8_8_ = uVar22;
            auVar25._0_8_ = uVar20;
            auVar58 = psubsw(stack0xfffffffffffff558,auVar25);
            local_418 = auVar83._0_2_;
            sStack_416 = auVar83._2_2_;
            sStack_414 = auVar83._4_2_;
            sStack_412 = auVar83._6_2_;
            sStack_410 = auVar83._8_2_;
            sStack_40e = auVar83._10_2_;
            sStack_40c = auVar83._12_2_;
            sStack_40a = auVar83._14_2_;
            local_428 = auVar58._0_2_;
            sStack_426 = auVar58._2_2_;
            sStack_424 = auVar58._4_2_;
            sStack_422 = auVar58._6_2_;
            sStack_420 = auVar58._8_2_;
            sStack_41e = auVar58._10_2_;
            sStack_41c = auVar58._12_2_;
            sStack_41a = auVar58._14_2_;
            uVar52 = (ushort)(local_418 < local_428) * local_428 |
                     (ushort)(local_418 >= local_428) * local_418;
            uVar60 = (ushort)(sStack_416 < sStack_426) * sStack_426 |
                     (ushort)(sStack_416 >= sStack_426) * sStack_416;
            uVar63 = (ushort)(sStack_414 < sStack_424) * sStack_424 |
                     (ushort)(sStack_414 >= sStack_424) * sStack_414;
            uVar66 = (ushort)(sStack_412 < sStack_422) * sStack_422 |
                     (ushort)(sStack_412 >= sStack_422) * sStack_412;
            uVar69 = (ushort)(sStack_410 < sStack_420) * sStack_420 |
                     (ushort)(sStack_410 >= sStack_420) * sStack_410;
            uVar75 = (ushort)(sStack_40e < sStack_41e) * sStack_41e |
                     (ushort)(sStack_40e >= sStack_41e) * sStack_40e;
            uVar78 = (ushort)(sStack_40c < sStack_41c) * sStack_41c |
                     (ushort)(sStack_40c >= sStack_41c) * sStack_40c;
            uVar81 = (ushort)(sStack_40a < sStack_41a) * sStack_41a |
                     (ushort)(sStack_40a >= sStack_41a) * sStack_40a;
            vF[1] = CONCAT26(uVar66,CONCAT24(uVar63,CONCAT22(uVar60,uVar52)));
            vE[0]._0_2_ = uVar69;
            vE[0]._2_2_ = uVar75;
            vE[0]._4_2_ = uVar78;
            vE[0]._6_2_ = uVar81;
            uVar1 = (undefined2)piVar11[(long)(iVar3 * local_cac) + (long)piVar50[end_ref + -1]];
            j_00 = CONCAT22((short)((uint)j_00 >> 0x10),uVar1);
            auVar33._2_2_ = (short)piVar16[(long)(iVar8 * local_d24) + (long)piVar50[end_ref + -6]];
            auVar33._0_2_ = (short)piVar17[(long)(iVar9 * local_d3c) + (long)piVar50[end_ref + -7]];
            auVar33._4_2_ = (short)piVar15[(long)(iVar7 * local_d0c) + (long)piVar50[end_ref + -5]];
            auVar33._6_2_ = (short)piVar14[(long)(iVar6 * local_cf4) + (long)piVar50[end_ref + -4]];
            auVar33._10_2_ = (short)piVar12[(long)(iVar4 * local_cc4) + (long)piVar50[end_ref + -2]]
            ;
            auVar33._8_2_ = (short)piVar13[(long)(iVar5 * local_cdc) + (long)piVar50[end_ref + -3]];
            auVar33._12_2_ = uVar1;
            auVar33._14_2_ = (short)piVar10[(long)(iVar2 * local_c94) + (long)piVar50[end_ref]];
            auVar58 = paddsw(auVar30,auVar33);
            local_438 = auVar58._0_2_;
            sStack_436 = auVar58._2_2_;
            sStack_434 = auVar58._4_2_;
            sStack_432 = auVar58._6_2_;
            sStack_430 = auVar58._8_2_;
            sStack_42e = auVar58._10_2_;
            sStack_42c = auVar58._12_2_;
            sStack_42a = auVar58._14_2_;
            uVar52 = (local_438 < (short)uVar52) * uVar52 |
                     (ushort)(local_438 >= (short)uVar52) * local_438;
            uVar60 = (sStack_436 < (short)uVar60) * uVar60 |
                     (ushort)(sStack_436 >= (short)uVar60) * sStack_436;
            uVar63 = (sStack_434 < (short)uVar63) * uVar63 |
                     (ushort)(sStack_434 >= (short)uVar63) * sStack_434;
            uVar66 = (sStack_432 < (short)uVar66) * uVar66 |
                     (ushort)(sStack_432 >= (short)uVar66) * sStack_432;
            uVar69 = (sStack_430 < (short)uVar69) * uVar69 |
                     (ushort)(sStack_430 >= (short)uVar69) * sStack_430;
            uVar75 = (sStack_42e < (short)uVar75) * uVar75 |
                     (ushort)(sStack_42e >= (short)uVar75) * sStack_42e;
            uVar78 = (sStack_42c < (short)uVar78) * uVar78 |
                     (ushort)(sStack_42c >= (short)uVar78) * sStack_42c;
            uVar81 = (sStack_42a < (short)uVar81) * uVar81 |
                     (ushort)(sStack_42a >= (short)uVar81) * sStack_42a;
            vE[1] = CONCAT26(((short)uVar66 < (short)uVar65) * uVar65 |
                             ((short)uVar66 >= (short)uVar65) * uVar66,
                             CONCAT24(((short)uVar63 < (short)uVar62) * uVar62 |
                                      ((short)uVar63 >= (short)uVar62) * uVar63,
                                      CONCAT22(((short)uVar60 < (short)uVar59) * uVar59 |
                                               ((short)uVar60 >= (short)uVar59) * uVar60,
                                               ((short)uVar52 < (short)uVar51) * uVar51 |
                                               ((short)uVar52 >= (short)uVar51) * uVar52)));
            vWH[0]._0_2_ = ((short)uVar69 < (short)uVar68) * uVar68 |
                           ((short)uVar69 >= (short)uVar68) * uVar69;
            vWH[0]._2_2_ = ((short)uVar75 < (short)uVar74) * uVar74 |
                           ((short)uVar75 >= (short)uVar74) * uVar75;
            vWH[0]._4_2_ = ((short)uVar78 < (short)uVar77) * uVar77 |
                           ((short)uVar78 >= (short)uVar77) * uVar78;
            vWH[0]._6_2_ = ((short)uVar81 < (short)uVar80) * uVar80 |
                           ((short)uVar81 >= (short)uVar80) * uVar81;
            local_4b8 = (short)matrow0;
            sStack_4b6 = matrow0._2_2_;
            sStack_4b4 = matrow0._4_2_;
            sStack_4b2 = matrow0._6_2_;
            sStack_4b0 = matrow0._8_2_;
            sStack_4ae = matrow0._10_2_;
            sStack_4ac = matrow0._12_2_;
            sStack_4aa = matrow0._14_2_;
            sVar53 = -(ushort)(local_4b8 == -1);
            sVar61 = -(ushort)(sStack_4b6 == -1);
            sVar64 = -(ushort)(sStack_4b4 == -1);
            sVar67 = -(ushort)(sStack_4b2 == -1);
            sVar70 = -(ushort)(sStack_4b0 == -1);
            sVar76 = -(ushort)(sStack_4ae == -1);
            sVar79 = -(ushort)(sStack_4ac == -1);
            sVar82 = -(ushort)(sStack_4aa == -1);
            auVar45._2_2_ = sVar61;
            auVar45._0_2_ = sVar53;
            auVar45._4_2_ = sVar64;
            auVar45._6_2_ = sVar67;
            auVar45._10_2_ = sVar76;
            auVar45._8_2_ = sVar70;
            auVar45._12_2_ = sVar79;
            auVar45._14_2_ = sVar82;
            auVar46._8_8_ = vWH[0];
            auVar46._0_8_ = vE[1];
            register0x00001240 = pblendvb(auVar46,stack0xfffffffffffff588,auVar45);
            auVar42._2_2_ = sVar61;
            auVar42._0_2_ = sVar53;
            auVar42._4_2_ = sVar64;
            auVar42._6_2_ = sVar67;
            auVar42._10_2_ = sVar76;
            auVar42._8_2_ = sVar70;
            auVar42._12_2_ = sVar79;
            auVar42._14_2_ = sVar82;
            auVar44._8_8_ = vF[0];
            auVar44._0_8_ = vJ[1];
            auVar43._8_8_ = uVar73;
            auVar43._0_8_ = uVar18;
            register0x00001240 = pblendvb(auVar44,auVar43,auVar42);
            auVar39._2_2_ = sVar61;
            auVar39._0_2_ = sVar53;
            auVar39._4_2_ = sVar64;
            auVar39._6_2_ = sVar67;
            auVar39._10_2_ = sVar76;
            auVar39._8_2_ = sVar70;
            auVar39._12_2_ = sVar79;
            auVar39._14_2_ = sVar82;
            auVar41._8_8_ = vE[0];
            auVar41._0_8_ = vF[1];
            auVar40._8_8_ = uVar73;
            auVar40._0_8_ = uVar18;
            register0x00001240 = pblendvb(auVar41,auVar40,auVar39);
            sStack_206 = vE[1]._2_2_;
            sStack_204 = vE[1]._4_2_;
            sStack_202 = vE[1]._6_2_;
            sStack_1fe = vE[2]._2_2_;
            sStack_1fc = vE[2]._4_2_;
            sStack_1fa = vE[2]._6_2_;
            sStack_200 = (short)vE[2];
            if (7 < end_ref) {
              local_1f8 = (short)vSaturationCheckMax[1];
              sStack_1f6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
              sStack_1f4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
              sStack_1f2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
              sStack_1f0 = (short)vSaturationCheckMin[0];
              sStack_1ee = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
              sStack_1ec = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
              sStack_1ea = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
              vSaturationCheckMax[1] =
                   CONCAT26((ushort)(sStack_202 < sStack_1f2) * sStack_202 |
                            (ushort)(sStack_202 >= sStack_1f2) * sStack_1f2,
                            CONCAT24((ushort)(sStack_204 < sStack_1f4) * sStack_204 |
                                     (ushort)(sStack_204 >= sStack_1f4) * sStack_1f4,
                                     CONCAT22((ushort)(sStack_206 < sStack_1f6) * sStack_206 |
                                              (ushort)(sStack_206 >= sStack_1f6) * sStack_1f6,
                                              (ushort)((short)vE[1] < local_1f8) * (short)vE[1] |
                                              (ushort)((short)vE[1] >= local_1f8) * local_1f8)));
              vSaturationCheckMin[0] =
                   CONCAT26((ushort)(sStack_1fa < sStack_1ea) * sStack_1fa |
                            (ushort)(sStack_1fa >= sStack_1ea) * sStack_1ea,
                            CONCAT24((ushort)(sStack_1fc < sStack_1ec) * sStack_1fc |
                                     (ushort)(sStack_1fc >= sStack_1ec) * sStack_1ec,
                                     CONCAT22((ushort)(sStack_1fe < sStack_1ee) * sStack_1fe |
                                              (ushort)(sStack_1fe >= sStack_1ee) * sStack_1ee,
                                              (ushort)(sStack_200 < sStack_1f0) * sStack_200 |
                                              (ushort)(sStack_200 >= sStack_1f0) * sStack_1f0)));
              local_478 = (short)vNegInf[1];
              sStack_476 = (short)((ulong)vNegInf[1] >> 0x10);
              sStack_474 = (short)((ulong)vNegInf[1] >> 0x20);
              sStack_472 = (short)((ulong)vNegInf[1] >> 0x30);
              sStack_470 = (short)vSaturationCheckMax[0];
              sStack_46e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
              sStack_46c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
              sStack_46a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
              vNegInf[1] = CONCAT26((ushort)(sStack_472 < sStack_202) * sStack_202 |
                                    (ushort)(sStack_472 >= sStack_202) * sStack_472,
                                    CONCAT24((ushort)(sStack_474 < sStack_204) * sStack_204 |
                                             (ushort)(sStack_474 >= sStack_204) * sStack_474,
                                             CONCAT22((ushort)(sStack_476 < sStack_206) * sStack_206
                                                      | (ushort)(sStack_476 >= sStack_206) *
                                                        sStack_476,
                                                      (ushort)(local_478 < (short)vE[1]) *
                                                      (short)vE[1] |
                                                      (ushort)(local_478 >= (short)vE[1]) *
                                                      local_478)));
              vSaturationCheckMax[0] =
                   CONCAT26((ushort)(sStack_46a < sStack_1fa) * sStack_1fa |
                            (ushort)(sStack_46a >= sStack_1fa) * sStack_46a,
                            CONCAT24((ushort)(sStack_46c < sStack_1fc) * sStack_1fc |
                                     (ushort)(sStack_46c >= sStack_1fc) * sStack_46c,
                                     CONCAT22((ushort)(sStack_46e < sStack_1fe) * sStack_1fe |
                                              (ushort)(sStack_46e >= sStack_1fe) * sStack_46e,
                                              (ushort)(sStack_470 < sStack_200) * sStack_200 |
                                              (ushort)(sStack_470 >= sStack_200) * sStack_470)));
            }
            vWH_00[0] = (ulong)(uint)end_query;
            vWH_00[1]._0_4_ = local_c30;
            vWH_00[1]._4_4_ = 0;
            arr_store_si128(((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_row,vWH_00,
                            end_ref,s2Len,j_00,(int32_t)piVar50);
            ptr_00[(long)(end_ref + -7) + 7] = (short)vE[1];
            ptr_01[(long)(end_ref + -7) + 7] = (int16_t)vJ[1];
            local_4e8 = auVar57._0_2_;
            sStack_4e6 = auVar57._2_2_;
            sStack_4e4 = auVar57._4_2_;
            sStack_4e2 = auVar57._6_2_;
            sStack_4e0 = auVar57._8_2_;
            sStack_4de = auVar57._10_2_;
            sStack_4dc = auVar57._12_2_;
            sStack_4da = auVar57._14_2_;
            local_148 = (short)vMaxHCol[1];
            sStack_146 = vMaxHCol[1]._2_2_;
            sStack_144 = vMaxHCol[1]._4_2_;
            sStack_142 = vMaxHCol[1]._6_2_;
            sStack_140 = (short)vMaxHCol[2];
            sStack_13e = vMaxHCol[2]._2_2_;
            sStack_13c = vMaxHCol[2]._4_2_;
            sStack_13a = vMaxHCol[2]._6_2_;
            local_168 = (short)vLastVal[1];
            sStack_166 = vLastVal[1]._2_2_;
            sStack_164 = vLastVal[1]._4_2_;
            sStack_162 = vLastVal[1]._6_2_;
            sStack_160 = (short)vLastVal[2];
            sStack_15e = vLastVal[2]._2_2_;
            sStack_15c = vLastVal[2]._4_2_;
            sStack_15a = vLastVal[2]._6_2_;
            uVar54 = CONCAT26(-(ushort)(sStack_142 < sStack_202),
                              CONCAT24(-(ushort)(sStack_144 < sStack_204),
                                       CONCAT22(-(ushort)(sStack_146 < sStack_206),
                                                -(ushort)(local_148 < (short)vE[1])))) &
                     CONCAT26(-(ushort)(sStack_1e2 == sStack_4a2),
                              CONCAT24(-(ushort)(sStack_1e4 == sStack_4a4),
                                       CONCAT22(-(ushort)(sStack_1e6 == sStack_4a6),
                                                -(ushort)(local_1e8 == local_4a8)))) &
                     CONCAT26(-(ushort)(-1 < sStack_4b2),
                              CONCAT24(-(ushort)(-1 < sStack_4b4),
                                       CONCAT22(-(ushort)(-1 < sStack_4b6),-(ushort)(-1 < local_4b8)
                                               ))) &
                     CONCAT26(-(ushort)(sStack_4b2 < (short)gap_local),
                              CONCAT24(-(ushort)(sStack_4b4 < (short)gap_local),
                                       CONCAT22(-(ushort)(sStack_4b6 < (short)gap_local),
                                                -(ushort)(local_4b8 < (short)gap_local))));
            uVar71 = CONCAT26(-(ushort)(sStack_13a < sStack_1fa),
                              CONCAT24(-(ushort)(sStack_13c < sStack_1fc),
                                       CONCAT22(-(ushort)(sStack_13e < sStack_1fe),
                                                -(ushort)(sStack_140 < sStack_200)))) &
                     CONCAT26(-(ushort)(sStack_1da == sStack_49a),
                              CONCAT24(-(ushort)(sStack_1dc == sStack_49c),
                                       CONCAT22(-(ushort)(sStack_1de == sStack_49e),
                                                -(ushort)(sStack_1e0 == sStack_4a0)))) &
                     CONCAT26(-(ushort)(-1 < sStack_4aa),
                              CONCAT24(-(ushort)(-1 < sStack_4ac),
                                       CONCAT22(-(ushort)(-1 < sStack_4ae),
                                                -(ushort)(-1 < sStack_4b0)))) &
                     CONCAT26(-(ushort)(sStack_4aa < (short)gap_local),
                              CONCAT24(-(ushort)(sStack_4ac < (short)gap_local),
                                       CONCAT22(-(ushort)(sStack_4ae < (short)gap_local),
                                                -(ushort)(sStack_4b0 < (short)gap_local))));
            uVar55 = CONCAT26(-(ushort)(sStack_162 < sStack_202),
                              CONCAT24(-(ushort)(sStack_164 < sStack_204),
                                       CONCAT22(-(ushort)(sStack_166 < sStack_206),
                                                -(ushort)(local_168 < (short)vE[1])))) &
                     CONCAT26(-(ushort)(sStack_1e2 < (short)s2Len_PAD),
                              CONCAT24(-(ushort)(sStack_1e4 < (short)s2Len_PAD),
                                       CONCAT22(-(ushort)(sStack_1e6 < (short)s2Len_PAD),
                                                -(ushort)(local_1e8 < (short)s2Len_PAD)))) &
                     CONCAT26(-(ushort)(sStack_4b2 == sStack_4e2),
                              CONCAT24(-(ushort)(sStack_4b4 == sStack_4e4),
                                       CONCAT22(-(ushort)(sStack_4b6 == sStack_4e6),
                                                -(ushort)(local_4b8 == local_4e8))));
            uVar72 = CONCAT26(-(ushort)(sStack_15a < sStack_1fa),
                              CONCAT24(-(ushort)(sStack_15c < sStack_1fc),
                                       CONCAT22(-(ushort)(sStack_15e < sStack_1fe),
                                                -(ushort)(sStack_160 < sStack_200)))) &
                     CONCAT26(-(ushort)(sStack_1da < sStack_1ca),
                              CONCAT24(-(ushort)(sStack_1dc < sStack_1cc),
                                       CONCAT22(-(ushort)(sStack_1de < sStack_1ce),
                                                -(ushort)(sStack_1e0 < sStack_1d0)))) &
                     CONCAT26(-(ushort)(sStack_4aa == sStack_4da),
                              CONCAT24(-(ushort)(sStack_4ac == sStack_4dc),
                                       CONCAT22(-(ushort)(sStack_4ae == sStack_4de),
                                                -(ushort)(sStack_4b0 == sStack_4e0))));
            auVar38._8_8_ = uVar71;
            auVar38._0_8_ = uVar54;
            register0x00001240 = pblendvb(stack0xfffffffffffff618,register0x00001240,auVar38);
            auVar37._8_8_ = uVar72;
            auVar37._0_8_ = uVar55;
            register0x00001240 = pblendvb(stack0xfffffffffffff608,register0x00001240,auVar37);
            auVar36._8_8_ =
                 CONCAT26(-(ushort)(sStack_1da == sStack_49a),
                          CONCAT24(-(ushort)(sStack_1dc == sStack_49c),
                                   CONCAT22(-(ushort)(sStack_1de == sStack_49e),
                                            -(ushort)(sStack_1e0 == sStack_4a0)))) &
                 CONCAT26(-(ushort)(sStack_4aa == sStack_4da),
                          CONCAT24(-(ushort)(sStack_4ac == sStack_4dc),
                                   CONCAT22(-(ushort)(sStack_4ae == sStack_4de),
                                            -(ushort)(sStack_4b0 == sStack_4e0))));
            auVar36._0_8_ =
                 CONCAT26(-(ushort)(sStack_1e2 == sStack_4a2),
                          CONCAT24(-(ushort)(sStack_1e4 == sStack_4a4),
                                   CONCAT22(-(ushort)(sStack_1e6 == sStack_4a6),
                                            -(ushort)(local_1e8 == local_4a8)))) &
                 CONCAT26(-(ushort)(sStack_4b2 == sStack_4e2),
                          CONCAT24(-(ushort)(sStack_4b4 == sStack_4e4),
                                   CONCAT22(-(ushort)(sStack_4b6 == sStack_4e6),
                                            -(ushort)(local_4b8 == local_4e8))));
            register0x00001240 = pblendvb(stack0xfffffffffffff5f8,register0x00001240,auVar36);
            auVar35._8_8_ = uVar72;
            auVar35._0_8_ = uVar55;
            register0x00001240 = pblendvb(stack0xfffffffffffff5e8,stack0xfffffffffffff638,auVar35);
            auVar34._8_8_ = uVar71;
            auVar34._0_8_ = uVar54;
            register0x00001240 = pblendvb(stack0xfffffffffffff5d8,_matrow0,auVar34);
            auVar32._8_8_ = 0x1000100010001;
            auVar32._0_8_ = 0x1000100010001;
            _matrow0 = paddsw(_matrow0,auVar32);
            unique0x10004196 = auVar24;
          }
          auVar31._8_8_ = 0x8000800080008;
          auVar31._0_8_ = 0x8000800080008;
          register0x00001200 = paddsw(stack0xfffffffffffff638,auVar31);
          auVar24._8_8_ = uStack_c50;
          auVar24._0_8_ = local_c58;
          register0x00001200 = psubsw(stack0xfffffffffffff588,auVar24);
        }
        t = (int16_t *)(vMaxHCol + 1);
        u = (int16_t *)(vLastVal + 1);
        i_1 = (int16_t *)(vEndI + 1);
        j_1 = (int16_t *)(vEndJ + 1);
        plStack_c28 = vILimit + 1;
        s._2_2_ = sVar48;
        s._4_2_ = sVar48;
        s._6_2_ = sVar48;
        for (local_c2c = 0; local_c2c < 8; local_c2c = local_c2c + 1) {
          if ((s._4_2_ < *u) || ((*u == s._4_2_ && (*j_1 < _POS_LIMIT)))) {
            s._4_2_ = *u;
            _POS_LIMIT = (int)*j_1;
          }
          if (s._6_2_ < *t) {
            s._6_2_ = *t;
            iStack_900 = (int)(short)*plStack_c28;
          }
          if (s._2_2_ < *i_1) {
            s._2_2_ = *i_1;
          }
          t = t + 1;
          u = u + 1;
          i_1 = i_1 + 1;
          j_1 = j_1 + 1;
          plStack_c28 = (longlong *)((long)plStack_c28 + 2);
        }
        if ((s1_end == 0) || (s2_end == 0)) {
          if (s1_end == 0) {
            if (s2_end == 0) {
              vNegLimit[1]._2_2_ = s._2_2_;
              iStack_900 = s2Len + -1;
            }
            else {
              vNegLimit[1]._2_2_ = s._6_2_;
            }
            _POS_LIMIT = local_c30 + -1;
          }
          else {
            vNegLimit[1]._2_2_ = s._4_2_;
            iStack_900 = s2Len + -1;
          }
        }
        else if ((s._6_2_ < s._4_2_) || ((s._4_2_ == s._6_2_ && (iStack_900 == s2Len + -1)))) {
          vNegLimit[1]._2_2_ = s._4_2_;
          iStack_900 = s2Len + -1;
        }
        else {
          vNegLimit[1]._2_2_ = s._6_2_;
          _POS_LIMIT = local_c30 + -1;
        }
        local_1a8 = (short)vSaturationCheckMax[1];
        sStack_1a6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_1a4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_1a2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_1a0 = (short)vSaturationCheckMin[0];
        sStack_19e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_19c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_19a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_178 = (short)vNegInf[1];
        sStack_176 = (short)((ulong)vNegInf[1] >> 0x10);
        sStack_174 = (short)((ulong)vNegInf[1] >> 0x20);
        sStack_172 = (short)((ulong)vNegInf[1] >> 0x30);
        sStack_170 = (short)vSaturationCheckMax[0];
        sStack_16e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_16c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_16a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        uVar73 = CONCAT26(-(ushort)(sStack_19a < sVar48),
                          CONCAT24(-(ushort)(sStack_19c < sVar48),
                                   CONCAT22(-(ushort)(sStack_19e < sVar48),
                                            -(ushort)(sStack_1a0 < sVar48)))) |
                 CONCAT26(-(ushort)(sVar49 < sStack_16a),
                          CONCAT24(-(ushort)(sVar49 < sStack_16c),
                                   CONCAT22(-(ushort)(sVar49 < sStack_16e),
                                            -(ushort)(sVar49 < sStack_170))));
        auVar47._8_8_ = uVar73;
        auVar47._0_8_ =
             CONCAT26(-(ushort)(sStack_1a2 < sVar48),
                      CONCAT24(-(ushort)(sStack_1a4 < sVar48),
                               CONCAT22(-(ushort)(sStack_1a6 < sVar48),-(ushort)(local_1a8 < sVar48)
                                       ))) |
             CONCAT26(-(ushort)(sVar49 < sStack_172),
                      CONCAT24(-(ushort)(sVar49 < sStack_174),
                               CONCAT22(-(ushort)(sVar49 < sStack_176),-(ushort)(sVar49 < local_178)
                                       )));
        if ((((((((((((((((auVar47 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar47 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar47 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar47 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar47 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar47 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar73 >> 7 & 1) != 0) || (uVar73 >> 0xf & 1) != 0) || (uVar73 >> 0x17 & 1) != 0)
               || (uVar73 >> 0x1f & 1) != 0) || (uVar73 >> 0x27 & 1) != 0) ||
             (uVar73 >> 0x2f & 1) != 0) || (uVar73 >> 0x37 & 1) != 0) || (long)uVar73 < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          vNegLimit[1]._2_2_ = 0;
          _POS_LIMIT = 0;
          iStack_900 = 0;
        }
        ((parasail_result_t *)_s1_local)->score = (int)vNegLimit[1]._2_2_;
        ((parasail_result_t *)_s1_local)->end_query = _POS_LIMIT;
        ((parasail_result_t *)_s1_local)->end_ref = iStack_900;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(s2B);
        }
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = s1_beg ? _mm_set1_epi16(0) : _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi16(0) : _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi16(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 2);
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_srli_si128(vWH, 2);
        vWH = _mm_insert_epi16(vWH, s1_beg ? 0 : (-open - i*gap), 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi16(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi16(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi16(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi16(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int16_t max_row = NEG_LIMIT;
        int16_t max_col = NEG_LIMIT;
        int16_t last_val = NEG_LIMIT;
        int16_t *s = (int16_t*)&vMaxHRow;
        int16_t *t = (int16_t*)&vMaxHCol;
        int16_t *u = (int16_t*)&vLastVal;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}